

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

void __thiscall
lodepng::ExtractZlib::getTreeInflateDynamic
          (ExtractZlib *this,HuffmanTree *tree,HuffmanTree *treeD,uchar *in,size_t *bp,
          size_t inlength)

{
  byte bVar1;
  iterator iVar2;
  ExtractZlib *this_00;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  pointer puVar6;
  size_t sVar7;
  long lVar8;
  unsigned_long *puVar9;
  pointer puVar10;
  ulong uVar11;
  pointer puVar12;
  long lVar13;
  unsigned_long uVar14;
  pointer puVar15;
  uint uVar16;
  unsigned_long *puVar17;
  unsigned_long *puVar18;
  long lVar19;
  size_t i_1;
  unsigned_long result;
  long lVar20;
  bool bVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bitlen;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bitlenD;
  vector<unsigned_long,_std::allocator<unsigned_long>_> codelengthcode;
  int local_dc;
  ulong local_d8;
  pointer local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  pointer local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  long local_68;
  long local_60;
  ExtractZlib *local_58;
  size_t local_50;
  HuffmanTree *local_48;
  HuffmanTree *local_40;
  HuffmanTree *local_38;
  
  local_50 = *bp;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = treeD;
  local_40 = tree;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x900);
  puVar6 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 0x120;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar6;
  memset(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x900);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar6;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x100);
  puVar6 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 0x20;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar6;
  memset(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x100);
  uVar11 = *bp;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar6;
  if (uVar11 >> 3 < inlength - 2) {
    lVar8 = 0;
    lVar20 = 0;
    uVar5 = uVar11;
    do {
      uVar4 = uVar5;
      bVar1 = in[uVar4 >> 3];
      uVar5 = uVar4 + 1;
      *bp = uVar5;
      lVar20 = lVar20 + ((ulong)((bVar1 >> ((uint)uVar4 & 7) & 1) != 0) << ((byte)lVar8 & 0x3f));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    lVar8 = 0;
    lVar19 = 0;
    do {
      bVar1 = in[uVar5 + lVar8 >> 3];
      *bp = uVar5 + lVar8 + 1;
      lVar19 = lVar19 + ((ulong)((bVar1 >> ((int)uVar11 + 5 + (int)lVar8 & 7U) & 1) != 0) <<
                        ((byte)lVar8 & 0x3f));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    lVar8 = 0;
    lVar13 = 0;
    uVar11 = uVar4 + 6;
    do {
      bVar1 = in[uVar11 >> 3];
      uVar16 = (uint)uVar11;
      uVar11 = uVar11 + 1;
      *bp = uVar4 + 6 + lVar8 + 1;
      lVar13 = lVar13 + ((ulong)((bVar1 >> (uVar16 & 7) & 1) != 0) << ((byte)lVar8 & 0x3f));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar8 = *(long *)(this->zlibinfo + 8);
    *(int *)(lVar8 + -0x110) = (int)lVar20;
    *(int *)(lVar8 + -0x10c) = (int)lVar19;
    *(int *)(lVar8 + -0x108) = (int)lVar13;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8 = inlength;
    local_58 = this;
    puVar6 = (pointer)operator_new(0x98);
    local_90 = (pointer)(lVar20 + 0x101);
    local_d0 = puVar6 + 0x13;
    uVar11 = 0;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = puVar6;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_d0;
    local_60 = lVar20;
    memset(puVar6,0,0x98);
    this_00 = local_58;
    local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = local_d0;
    sVar7 = *bp;
    do {
      if (uVar11 < lVar13 + 4U) {
        lVar8 = 0;
        uVar14 = 0;
        do {
          bVar1 = in[sVar7 + lVar8 >> 3];
          *bp = sVar7 + lVar8 + 1;
          uVar14 = uVar14 + ((ulong)((bVar1 >> ((uint)(sVar7 + lVar8) & 7) & 1) != 0) <<
                            ((byte)lVar8 & 0x3f));
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        sVar7 = sVar7 + 3;
      }
      else {
        uVar14 = 0;
      }
      puVar6[(&CLCL)[uVar11]] = uVar14;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x13);
    if (local_d0 !=
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar11 = 0;
      do {
        lVar8 = *(long *)(this_00->zlibinfo + 8);
        local_dc = (int)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar11];
        iVar2._M_current = *(int **)(lVar8 + -0xf8);
        if (iVar2._M_current == *(int **)(lVar8 + -0xf0)) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)(lVar8 + -0x100),iVar2,&local_dc);
        }
        else {
          *iVar2._M_current = local_dc;
          *(int **)(lVar8 + -0xf8) = iVar2._M_current + 1;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)local_88.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_88.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    local_38 = &this_00->codelengthcodetree;
    iVar3 = HuffmanTree::makeFromLengths(local_38,&local_88,7);
    this_00->error = iVar3;
    if (iVar3 == 0) {
      local_d0 = (pointer)(local_60 + lVar19 + 0x102);
      local_68 = local_60 * -8;
      puVar6 = (pointer)0x0;
      uVar11 = local_d8;
      do {
        if (local_d0 <= puVar6) {
          if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[0x100] == 0) {
            this_00->error = 0x40;
          }
          else {
            iVar3 = HuffmanTree::makeFromLengths(local_40,&local_c8,0xf);
            this_00->error = iVar3;
            if (iVar3 == 0) {
              iVar3 = HuffmanTree::makeFromLengths(local_48,&local_a8,0xf);
              this_00->error = iVar3;
              if (iVar3 == 0) {
                *(size_t *)(*(long *)(this_00->zlibinfo + 8) + -0x118) = *bp - local_50;
                if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  uVar11 = 0;
                  do {
                    lVar8 = *(long *)(this_00->zlibinfo + 8);
                    local_dc = (int)local_c8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar11];
                    iVar2._M_current = *(int **)(lVar8 + -200);
                    if (iVar2._M_current == *(int **)(lVar8 + -0xc0)) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                ((vector<int,_std::allocator<int>_> *)(lVar8 + -0xd0),iVar2,
                                 &local_dc);
                    }
                    else {
                      *iVar2._M_current = local_dc;
                      *(int **)(lVar8 + -200) = iVar2._M_current + 1;
                    }
                    uVar11 = uVar11 + 1;
                  } while (uVar11 < (ulong)((long)local_c8.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_c8.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
                }
                if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish !=
                    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  uVar11 = 0;
                  do {
                    lVar8 = *(long *)(this_00->zlibinfo + 8);
                    local_dc = (int)local_a8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar11];
                    iVar2._M_current = *(int **)(lVar8 + -0xb0);
                    if (iVar2._M_current == *(int **)(lVar8 + -0xa8)) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                ((vector<int,_std::allocator<int>_> *)(lVar8 + -0xb8),iVar2,
                                 &local_dc);
                    }
                    else {
                      *iVar2._M_current = local_dc;
                      *(int **)(lVar8 + -0xb0) = iVar2._M_current + 1;
                    }
                    uVar11 = uVar11 + 1;
                  } while (uVar11 < (ulong)((long)local_a8.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_a8.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
                }
              }
            }
          }
          break;
        }
        uVar14 = huffmanDecodeSymbol(this_00,in,bp,local_38,uVar11);
        if (this_00->error == 0) {
          lVar8 = *(long *)(this_00->zlibinfo + 8);
          local_dc = (int)uVar14;
          iVar2._M_current = *(int **)(lVar8 + -0xe0);
          if (iVar2._M_current == *(int **)(lVar8 + -0xd8)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)(lVar8 + -0xe8),iVar2,&local_dc);
          }
          else {
            *iVar2._M_current = local_dc;
            *(int **)(lVar8 + -0xe0) = iVar2._M_current + 1;
          }
          if (uVar14 < 0x10) {
            if (puVar6 < local_90) {
              local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(long)puVar6] = uVar14;
            }
            else {
              local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(long)puVar6 - (long)local_90] = uVar14;
            }
            bVar21 = true;
            puVar6 = (pointer)((long)puVar6 + 1);
          }
          else if (uVar14 == 0x12) {
            uVar5 = *bp;
            if (uVar11 <= uVar5 >> 3) {
LAB_00120f43:
              this_00->error = 0x32;
              goto LAB_00120c8d;
            }
            lVar8 = 0;
            lVar20 = 0;
            do {
              bVar1 = in[uVar5 + lVar8 >> 3];
              *bp = uVar5 + 1 + lVar8;
              lVar20 = lVar20 + ((ulong)((bVar1 >> ((uint)(uVar5 + lVar8) & 7) & 1) != 0) <<
                                ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + 1;
            } while (lVar8 != 7);
            lVar20 = lVar20 + 0xb;
            lVar8 = *(long *)(this_00->zlibinfo + 8);
            local_dc = (int)lVar20;
            iVar2._M_current = *(int **)(lVar8 + -0xe0);
            if (iVar2._M_current == *(int **)(lVar8 + -0xd8)) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)(lVar8 + -0xe8),iVar2,&local_dc);
            }
            else {
              *iVar2._M_current = local_dc;
              *(int **)(lVar8 + -0xe0) = iVar2._M_current + 1;
            }
            bVar21 = true;
            uVar11 = local_d8;
            if (lVar20 != 0) {
              puVar12 = (pointer)((long)local_a8.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 (long)puVar6 * 8 + local_68 + -0x808);
              puVar10 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + (long)puVar6;
LAB_0012100b:
              if (puVar6 < local_d0) goto code_r0x00121012;
              this_00->error = 0xf;
LAB_00121049:
              bVar21 = false;
              uVar11 = local_d8;
            }
          }
          else if (uVar14 == 0x11) {
            uVar5 = *bp;
            if (uVar11 <= uVar5 >> 3) goto LAB_00120f43;
            lVar8 = 0;
            lVar20 = 0;
            do {
              bVar1 = in[uVar5 + lVar8 >> 3];
              *bp = uVar5 + 1 + lVar8;
              lVar20 = lVar20 + ((ulong)((bVar1 >> ((uint)(uVar5 + lVar8) & 7) & 1) != 0) <<
                                ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            lVar20 = lVar20 + 3;
            lVar8 = *(long *)(this_00->zlibinfo + 8);
            local_dc = (int)lVar20;
            iVar2._M_current = *(int **)(lVar8 + -0xe0);
            if (iVar2._M_current == *(int **)(lVar8 + -0xd8)) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)(lVar8 + -0xe8),iVar2,&local_dc);
            }
            else {
              *iVar2._M_current = local_dc;
              *(int **)(lVar8 + -0xe0) = iVar2._M_current + 1;
            }
            bVar21 = true;
            uVar11 = local_d8;
            if (lVar20 != 0) {
              puVar12 = (pointer)((long)local_a8.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 (long)puVar6 * 8 + local_68 + -0x808);
              puVar10 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + (long)puVar6;
              do {
                if (local_d0 <= puVar6) {
                  this_00->error = 0xe;
                  goto LAB_00121049;
                }
                puVar15 = puVar12;
                if (puVar6 < local_90) {
                  puVar15 = puVar10;
                }
                *puVar15 = 0;
                puVar6 = (pointer)((long)puVar6 + 1);
                puVar12 = puVar12 + 1;
                puVar10 = puVar10 + 1;
                lVar20 = lVar20 + -1;
              } while (lVar20 != 0);
            }
          }
          else {
            if (uVar14 != 0x10) {
              this_00->error = 0x10;
              goto LAB_00120c8d;
            }
            uVar5 = *bp;
            if (uVar11 <= uVar5 >> 3) goto LAB_00120f43;
            lVar20 = 0;
            lVar8 = 0;
            do {
              lVar19 = lVar8;
              lVar13 = (ulong)((in[uVar5 + lVar20 >> 3] >> ((uint)(uVar5 + lVar20) & 7) & 1) != 0)
                       << ((byte)lVar20 & 0x3f);
              *bp = uVar5 + 1 + lVar20;
              lVar8 = lVar13 + lVar19;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 2);
            puVar10 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + (long)puVar6 + (-0x102 - local_60);
            if ((pointer)((long)puVar6 - 1U) < local_90) {
              puVar10 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + (long)puVar6 + -1;
            }
            bVar21 = lVar8 == -3;
            if (!bVar21) {
              puVar12 = puVar6;
              if (puVar6 < local_d0) {
                uVar14 = *puVar10;
                puVar9 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start + (long)puVar6;
                puVar17 = (unsigned_long *)
                          ((long)local_a8.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start +
                          (long)puVar6 * 8 + local_68 + -0x808);
                uVar5 = 0;
                do {
                  puVar18 = puVar17;
                  if ((pointer)((long)puVar6 + uVar5) < local_90) {
                    puVar18 = puVar9;
                  }
                  *puVar18 = uVar14;
                  if (lVar19 + lVar13 + 2U == uVar5) {
                    bVar21 = lVar8 + 3U <= uVar5 + 1;
                    puVar6 = (pointer)((long)puVar6 + uVar5 + 1);
                    goto LAB_00120e32;
                  }
                  uVar5 = uVar5 + 1;
                  puVar9 = puVar9 + 1;
                  puVar12 = (pointer)((long)puVar6 + uVar5);
                  puVar17 = puVar17 + 1;
                } while (puVar12 < local_d0);
                bVar21 = lVar8 + 3U <= uVar5;
              }
              this_00->error = 0xd;
              puVar6 = puVar12;
            }
          }
        }
        else {
LAB_00120c8d:
          bVar21 = false;
        }
LAB_00120e32:
      } while (bVar21);
    }
    if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    this->error = 0x31;
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
code_r0x00121012:
  puVar15 = puVar12;
  if (puVar6 < local_90) {
    puVar15 = puVar10;
  }
  *puVar15 = 0;
  puVar6 = (pointer)((long)puVar6 + 1);
  puVar12 = puVar12 + 1;
  puVar10 = puVar10 + 1;
  lVar20 = lVar20 + -1;
  if (lVar20 == 0) goto LAB_00120e32;
  goto LAB_0012100b;
}

Assistant:

void getTreeInflateDynamic(HuffmanTree& tree, HuffmanTree& treeD,
                             const unsigned char* in, size_t& bp, size_t inlength) {
    size_t bpstart = bp;
    //get the tree of a deflated block with dynamic tree, the tree itself is also Huffman compressed with a known tree
    std::vector<unsigned long> bitlen(288, 0), bitlenD(32, 0);
    if(bp >> 3 >= inlength - 2) { error = 49; return; } //the bit pointer is or will go past the memory
    size_t HLIT =  readBitsFromStream(bp, in, 5) + 257; //number of literal/length codes + 257
    size_t HDIST = readBitsFromStream(bp, in, 5) + 1; //number of dist codes + 1
    size_t HCLEN = readBitsFromStream(bp, in, 4) + 4; //number of code length codes + 4
    zlibinfo->back().hlit = HLIT - 257;
    zlibinfo->back().hdist = HDIST - 1;
    zlibinfo->back().hclen = HCLEN - 4;
    std::vector<unsigned long> codelengthcode(19); //lengths of tree to decode the lengths of the dynamic tree
    for(size_t i = 0; i < 19; i++) codelengthcode[CLCL[i]] = (i < HCLEN) ? readBitsFromStream(bp, in, 3) : 0;
    //code length code lengths
    for(size_t i = 0; i < codelengthcode.size(); i++) zlibinfo->back().clcl.push_back(codelengthcode[i]);
    error = codelengthcodetree.makeFromLengths(codelengthcode, 7); if(error) return;
    size_t i = 0, replength;
    while(i < HLIT + HDIST) {
      unsigned long code = huffmanDecodeSymbol(in, bp, codelengthcodetree, inlength); if(error) return;
      zlibinfo->back().treecodes.push_back(code); //tree symbol code
      if(code <= 15)  { if(i < HLIT) bitlen[i++] = code; else bitlenD[i++ - HLIT] = code; } //a length code
      else if(code == 16) { //repeat previous
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 3 + readBitsFromStream(bp, in, 2);
        unsigned long value; //set value to the previous code
        if((i - 1) < HLIT) value = bitlen[i - 1];
        else value = bitlenD[i - HLIT - 1];
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 13; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = value; else bitlenD[i++ - HLIT] = value;
        }
      } else if(code == 17) { //repeat "0" 3-10 times
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 3 + readBitsFromStream(bp, in, 3);
        zlibinfo->back().treecodes.push_back(replength); //tree symbol code repetitions
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 14; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = 0; else bitlenD[i++ - HLIT] = 0;
        }
      } else if(code == 18) { //repeat "0" 11-138 times
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 11 + readBitsFromStream(bp, in, 7);
        zlibinfo->back().treecodes.push_back(replength); //tree symbol code repetitions
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 15; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = 0; else bitlenD[i++ - HLIT] = 0;
        }
      }
      else { error = 16; return; } //error: somehow an unexisting code appeared. This can never happen.
    }
    if(bitlen[256] == 0) { error = 64; return; } //the length of the end code 256 must be larger than 0
    error = tree.makeFromLengths(bitlen, 15);
    if(error) return; //now we've finally got HLIT and HDIST, so generate the code trees, and the function is done
    error = treeD.makeFromLengths(bitlenD, 15);
    if(error) return;
    zlibinfo->back().treebits = bp - bpstart;
    //lit/len/end symbol lengths
    for(size_t j = 0; j < bitlen.size(); j++) zlibinfo->back().litlenlengths.push_back(bitlen[j]);
    //dist lengths
    for(size_t j = 0; j < bitlenD.size(); j++) zlibinfo->back().distlengths.push_back(bitlenD[j]);
  }